

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VScale(N_Vector X,N_Vector Z,sunindextype local_length,int myid)

{
  int iVar1;
  uint in_ECX;
  undefined8 in_RSI;
  N_Vector in_RDI;
  double dVar2;
  double dVar3;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  int iVar5;
  
  iVar5 = 0;
  uVar4 = 0;
  N_VConst(0x3fe0000000000000,in_RDI);
  dVar2 = get_time();
  N_VScale(0x4000000000000000,in_RDI,in_RDI);
  sync_device(in_RDI);
  dVar3 = get_time();
  iVar1 = check_ans((sunrealtype)CONCAT44(in_ECX,iVar5),
                    (N_Vector)CONCAT44(uVar4,in_stack_ffffffffffffffd8),(sunindextype)dVar2);
  if (iVar1 == 0) {
    if (in_ECX == 0) {
      printf("PASSED test -- N_VScale Case 1 \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScale Case 1, Proc %d \n",(ulong)in_ECX);
    iVar5 = iVar5 + 1;
  }
  dVar2 = max_time(in_RDI,dVar3 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VScale");
  }
  uVar4 = 0;
  N_VConst(0xbff0000000000000,in_RDI);
  N_VConst(0,in_RSI);
  dVar2 = get_time();
  N_VScale(0x3ff0000000000000,in_RDI,in_RSI);
  sync_device(in_RDI);
  dVar3 = get_time();
  iVar1 = check_ans((sunrealtype)CONCAT44(in_ECX,iVar5),
                    (N_Vector)CONCAT44(uVar4,in_stack_ffffffffffffffd8),(sunindextype)dVar2);
  if (iVar1 == 0) {
    if (in_ECX == 0) {
      printf("PASSED test -- N_VScale Case 2 \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScale Case 2, Proc %d \n",(ulong)in_ECX);
    iVar5 = iVar5 + 1;
  }
  dVar2 = max_time(in_RDI,dVar3 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VScale");
  }
  uVar4 = 0;
  N_VConst(0xbff0000000000000,in_RDI);
  N_VConst(0,in_RSI);
  dVar2 = get_time();
  N_VScale(0xbff0000000000000,in_RDI,in_RSI);
  sync_device(in_RDI);
  dVar3 = get_time();
  iVar1 = check_ans((sunrealtype)CONCAT44(in_ECX,iVar5),
                    (N_Vector)CONCAT44(uVar4,in_stack_ffffffffffffffd8),(sunindextype)dVar2);
  if (iVar1 == 0) {
    if (in_ECX == 0) {
      printf("PASSED test -- N_VScale Case 3 \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScale Case 3, Proc %d \n",(ulong)in_ECX);
    iVar5 = iVar5 + 1;
  }
  dVar2 = max_time(in_RDI,dVar3 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VScale");
  }
  uVar4 = 0;
  N_VConst(0xbfe0000000000000,in_RDI);
  N_VConst(0,in_RSI);
  dVar2 = get_time();
  N_VScale(0x4000000000000000,in_RDI,in_RSI);
  sync_device(in_RDI);
  dVar3 = get_time();
  iVar1 = check_ans((sunrealtype)CONCAT44(in_ECX,iVar5),
                    (N_Vector)CONCAT44(uVar4,in_stack_ffffffffffffffd8),(sunindextype)dVar2);
  if (iVar1 == 0) {
    if (in_ECX == 0) {
      printf("PASSED test -- N_VScale Case 4 \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScale Case 4, Proc %d \n",(ulong)in_ECX);
    iVar5 = iVar5 + 1;
  }
  dVar2 = max_time(in_RDI,dVar3 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VScale");
  }
  return iVar5;
}

Assistant:

int Test_N_VScale(N_Vector X, N_Vector Z, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;

  /*
   * Case 1: x = cx, VScaleBy
   */

  /* fill vector data */
  N_VConst(HALF, X);

  start_time = get_time();
  N_VScale(TWO, X, X);
  sync_device(X);
  stop_time = get_time();

  /* X should be vector of +1 */
  failure = check_ans(ONE, X, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VScale Case 1, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScale Case 1 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScale", maxt);

  /*
   * Case 2: z = x, VCopy
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  N_VConst(NEG_ONE, X);
  N_VConst(ZERO, Z);

  start_time = get_time();
  N_VScale(ONE, X, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of -1 */
  failure = check_ans(NEG_ONE, Z, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VScale Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScale Case 2 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScale", maxt);

  /*
   * Case 3: z = -x, VNeg
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  N_VConst(NEG_ONE, X);
  N_VConst(ZERO, Z);

  start_time = get_time();
  N_VScale(NEG_ONE, X, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of +1 */
  failure = check_ans(ONE, Z, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VScale Case 3, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScale Case 3 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScale", maxt);

  /*
   * Case 4: z = cx, All other cases
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  N_VConst(NEG_HALF, X);
  N_VConst(ZERO, Z);

  start_time = get_time();
  N_VScale(TWO, X, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z should be vector of -1 */
  failure = check_ans(NEG_ONE, Z, local_length);

  if (failure)
  {
    printf(">>> FAILED test -- N_VScale Case 4, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VScale Case 4 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScale", maxt);

  return (fails);
}